

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,realtype t,N_Vector f)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  
  if (stepper == (MRIStepInnerStepper)0x0) {
    iVar5 = -0x16;
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepInnerStepper_AddForcing",
                    "Inner stepper memory is NULL");
  }
  else {
    *stepper->vals = 1.0;
    *stepper->vecs = f;
    dVar1 = stepper->tshift;
    dVar2 = stepper->tscale;
    uVar3 = stepper->nforcing;
    uVar6 = 0;
    uVar4 = 0;
    if (0 < (int)uVar3) {
      uVar4 = (ulong)uVar3;
    }
    dVar7 = 1.0;
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      stepper->vals[uVar6 + 1] = dVar7;
      stepper->vecs[uVar6 + 1] = stepper->forcing[uVar6];
      dVar7 = dVar7 * ((t - dVar1) / dVar2);
    }
    N_VLinearCombination(uVar3 + 1,stepper->vals,stepper->vecs,f);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int MRIStepInnerStepper_AddForcing(MRIStepInnerStepper stepper,
                                   realtype t, N_Vector f)
{
  realtype tau, taui;
  int i;

  if (stepper == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepInnerStepper_AddForcing",
                    "Inner stepper memory is NULL");
    return ARK_ILL_INPUT;
  }

  /* always append the constant forcing term */
  stepper->vals[0] = ONE;
  stepper->vecs[0] = f;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - stepper->tshift) / (stepper->tscale);
  taui = ONE;

  for (i = 0; i < stepper->nforcing; i++) {
    stepper->vals[i+1] = taui;
    stepper->vecs[i+1] = stepper->forcing[i];
    taui *= tau;
  }

  N_VLinearCombination(stepper->nforcing + 1,
                       stepper->vals,
                       stepper->vecs,
                       f);

  return ARK_SUCCESS;
}